

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

constructor class_constructor(klass cls,type_id *args,size_t size)

{
  int iVar1;
  constructor args_00;
  undefined8 *puVar2;
  size_t *psVar3;
  undefined8 *in_RDI;
  constructor ctor;
  size_t constructor_size;
  size_t iterator;
  constructor size_00;
  constructor ctor_00;
  constructor local_8;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_8 = (constructor)0x0;
  }
  else {
    args_00 = (constructor)vector_size(in_RDI[5]);
    if (args_00 == (constructor)0x0) {
      log_write_impl_va("metacall",0x260,"class_constructor",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,3,"Class %s does not have any constructor",*in_RDI);
      local_8 = (constructor)0x0;
    }
    else if (args_00 == (constructor)0x1) {
      puVar2 = (undefined8 *)vector_at(in_RDI[5],0);
      local_8 = (constructor)*puVar2;
    }
    else {
      for (ctor_00 = (constructor)0x0; ctor_00 < args_00;
          ctor_00 = (constructor)((long)&ctor_00->visibility + 1)) {
        psVar3 = (size_t *)vector_at(in_RDI[5],ctor_00);
        size_00 = (constructor)*psVar3;
        iVar1 = constructor_compare(ctor_00,(type_id *)args_00,(size_t)size_00);
        if (iVar1 == 0) {
          return size_00;
        }
      }
      puVar2 = (undefined8 *)vector_at(in_RDI[5],0);
      local_8 = (constructor)*puVar2;
    }
  }
  return local_8;
}

Assistant:

constructor class_constructor(klass cls, type_id args[], size_t size)
{
	/* This method tries to find a valid constructor with correct types,
	* if this cannot be achieved, we return the default constructor and
	* we let the loader handle the new invokation with variadic arguments */
	if (cls == NULL)
	{
		return NULL;
	}

	size_t iterator, constructor_size = vector_size(cls->constructors);

	if (constructor_size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Class %s does not have any constructor", cls->name);
		return NULL;
	}
	else if (constructor_size == 1)
	{
		return vector_at_type(cls->constructors, 0, constructor);
	}

	for (iterator = 0; iterator < constructor_size; ++iterator)
	{
		constructor ctor = vector_at_type(cls->constructors, iterator, constructor);

		if (constructor_compare(ctor, args, size) == 0)
		{
			return ctor;
		}
	}

	/* Return default constructor if there is not a match */
	return vector_at_type(cls->constructors, 0, constructor);
}